

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O0

method_result __thiscall boost::python::override::operator()(override *this,int *a0)

{
  PyObject *pPVar1;
  _object *p_Var2;
  object_base *in_RSI;
  handle<_object> in_RDI;
  method_result *x;
  PyObject *in_stack_ffffffffffffff98;
  handle<_object> this_00;
  handle<_object> local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_00.m_p = in_RDI.m_p;
  pPVar1 = api::object_base::ptr(in_RSI);
  converter::arg_to_python<int>::arg_to_python
            ((arg_to_python<int> *)this_00.m_p,(int *)in_stack_ffffffffffffff98);
  p_Var2 = handle<_object>::get(&local_28);
  PyEval_CallFunction(pPVar1,"(O)",p_Var2);
  detail::method_result::method_result((method_result *)this_00.m_p,in_stack_ffffffffffffff98);
  converter::arg_to_python<int>::~arg_to_python((arg_to_python<int> *)0x3e6f0a);
  return (method_result)(handle<_object>)in_RDI.m_p;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}